

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

string * __thiscall
json11::(anonymous_namespace)::JsonParser::parse_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string *out_00;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  string *psVar4;
  long lVar5;
  JsonParser *pJVar6;
  size_t sVar7;
  long *plVar8;
  string *extraout_RAX;
  uint uVar9;
  string *psVar10;
  size_type *psVar11;
  undefined8 uVar12;
  JsonParser *pJVar13;
  string esc;
  string out;
  char buf_1 [12];
  char buf [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  _Alloc_hider local_80;
  size_type local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_3c [12];
  
  local_80._M_p = local_70;
  local_78 = 0;
  local_70[0] = 0;
  plVar8 = *this;
  psVar4 = *(string **)((long)this + 8);
  psVar10 = (string *)plVar8[1];
  if (psVar4 == psVar10) {
LAB_0013ba57:
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"unexpected end of input in string","");
    if (*(char *)((long)this + 0x18) == '\0') {
      std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c8);
    }
    *(undefined1 *)((long)this + 0x18) = 1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0013baa7:
    local_50._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
    uVar12 = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
LAB_0013bab9:
      operator_delete((void *)uVar12,local_50._M_allocated_capacity + 1);
    }
LAB_0013c0c8:
    psVar4 = (string *)local_70;
    if ((string *)local_80._M_p != psVar4) {
      operator_delete(local_80._M_p,CONCAT71(local_70._1_7_,local_70[0]) + 1);
      psVar4 = extraout_RAX;
    }
    return psVar4;
  }
  local_88 = &__return_storage_ptr__->field_2;
  pJVar13 = (JsonParser *)0xffffffffffffffff;
LAB_0013bae5:
  out_00 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
  *(string **)((long)this + 8) = out_00;
  lVar5 = *plVar8;
  bVar1 = *(byte *)((long)&(psVar4->_M_dataplus)._M_p + lVar5);
  if (bVar1 == 0x22) {
    anon_unknown_22::JsonParser::encode_utf8(pJVar13,(long)&local_80,out_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
    if ((string *)local_80._M_p == (string *)local_70) {
      local_88->_M_allocated_capacity = CONCAT71(local_70._1_7_,local_70[0]);
      *(undefined8 *)((long)local_88 + 8) = local_70._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_80._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(local_70._1_7_,local_70[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_78;
    local_78 = 0;
    local_70[0] = 0;
    local_80._M_p = (pointer)local_70;
    goto LAB_0013c0c8;
  }
  if (bVar1 < 0x20) {
    snprintf(local_3c,0xc,"(%d)",(ulong)(uint)bVar1);
    local_60._M_allocated_capacity = (size_type)&local_50;
    sVar7 = strlen(local_3c);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_70 + 0x10),local_3c,local_3c + sVar7);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)(local_70 + 0x10),0,(char *)0x0,0x15b790);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_a8.field_2._M_allocated_capacity = *psVar11;
      local_a8.field_2._8_8_ = plVar8[3];
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar11;
      local_a8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_a8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_c8.field_2._M_allocated_capacity = *psVar11;
      local_c8.field_2._8_4_ = (undefined4)plVar8[3];
      local_c8.field_2._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar11;
      local_c8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_c8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (*(char *)((long)this + 0x18) == '\0') {
      std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c8);
    }
    *(undefined1 *)((long)this + 0x18) = 1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_60._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_allocated_capacity != &local_50) goto LAB_0013bab9;
    goto LAB_0013c0c8;
  }
  if (bVar1 == 0x5c) {
    if (out_00 == psVar10) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"unexpected end of input in string","");
      if (*(char *)((long)this + 0x18) == '\0') {
        std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c8);
      }
      *(undefined1 *)((long)this + 0x18) = 1;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0013baa7;
    }
    psVar10 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 2);
    *(string **)((long)this + 8) = psVar10;
    bVar1 = *(byte *)((long)&(psVar4->_M_dataplus)._M_p + lVar5 + 1);
    if ((int)(char)bVar1 == 0x75) {
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)plVar8);
      if (local_c8._M_string_length < 4) {
        std::operator+(&local_a8,"bad \\u escape: ",&local_c8);
        if (*(char *)((long)this + 0x18) == '\0') {
          std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_a8);
        }
        *(undefined1 *)((long)this + 0x18) = 1;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0013bb91:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
        pJVar6 = pJVar13;
      }
      else {
        lVar5 = 0;
        do {
          if ((9 < (byte)(local_c8._M_dataplus._M_p[lVar5] - 0x30U)) &&
             ((uVar9 = (byte)local_c8._M_dataplus._M_p[lVar5] - 0x41, 0x25 < uVar9 ||
              ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0)))) {
            std::operator+(&local_a8,"bad \\u escape: ",&local_c8);
            if (*(char *)((long)this + 0x18) == '\0') {
              std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_a8);
            }
            *(undefined1 *)((long)this + 0x18) = 1;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
            goto LAB_0013bb91;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        pJVar6 = (JsonParser *)strtol(local_c8._M_dataplus._M_p,(char **)0x0,0x10);
        if (((ulong)pJVar6 & 0xfffffffffffffc00) == 0xdc00 &&
            ((ulong)pJVar13 & 0xfffffffffffffc00) == 0xd800) {
          pJVar13 = pJVar6 + (long)pJVar13 * 0x20 + -0x1afee0;
          pJVar6 = (JsonParser *)0xffffffffffffffff;
          anon_unknown_22::JsonParser::encode_utf8
                    (pJVar13,(long)&local_80,(string *)0xfffffffffffffc00);
        }
        else {
          anon_unknown_22::JsonParser::encode_utf8
                    (pJVar13,(long)&local_80,(string *)0xfffffffffffffc00);
        }
        *(long *)((long)this + 8) = *(long *)((long)this + 8) + 4;
        bVar2 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) goto LAB_0013c0c8;
      goto LAB_0013bcff;
    }
    anon_unknown_22::JsonParser::encode_utf8(pJVar13,(long)&local_80,psVar10);
    bVar3 = (byte)(bVar1 + 0x9e) >> 1 | bVar1 * -0x80;
    if ((bVar3 < 10) && ((0x345U >> (bVar3 & 0x1f) & 1) != 0)) goto LAB_0013bc16;
    uVar9 = (uint)bVar1;
    if ((0x3a < uVar9 - 0x22) || ((0x400000000002001U >> ((ulong)(uVar9 - 0x22) & 0x3f) & 1) == 0))
    {
      if ((char)bVar1 < ' ') {
        snprintf(local_70 + 0x10,0xc,"(%d)",(ulong)(uint)(int)(char)bVar1);
      }
      else {
        snprintf(local_70 + 0x10,0xc,"\'%c\' (%d)",(ulong)uVar9,(ulong)uVar9);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      sVar7 = strlen(local_70 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,local_70 + 0x10,local_70 + sVar7 + 0x10);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x15b7ab);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_c8.field_2._M_allocated_capacity = *psVar11;
        local_c8.field_2._8_4_ = (undefined4)plVar8[3];
        local_c8.field_2._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar11;
        local_c8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_c8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (*(char *)((long)this + 0x18) == '\0') {
        std::__cxx11::string::operator=(*(string **)((long)this + 0x10),(string *)&local_c8);
      }
      *(undefined1 *)((long)this + 0x18) = 1;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      local_50._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
      uVar12 = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_0013bab9;
      goto LAB_0013c0c8;
    }
  }
  else {
    anon_unknown_22::JsonParser::encode_utf8(pJVar13,(long)&local_80,out_00);
  }
LAB_0013bc16:
  pJVar6 = (JsonParser *)0xffffffffffffffff;
  std::__cxx11::string::push_back((char)&local_80);
LAB_0013bcff:
  plVar8 = *this;
  psVar4 = *(string **)((long)this + 8);
  psVar10 = (string *)plVar8[1];
  pJVar13 = pJVar6;
  if (psVar4 == psVar10) goto LAB_0013ba57;
  goto LAB_0013bae5;
}

Assistant:

string parse_string() {
        string out;
        long last_escaped_codepoint = -1;
        while (true) {
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            char ch = str[i++];

            if (ch == '"') {
                encode_utf8(last_escaped_codepoint, out);
                return out;
            }

            if (in_range(ch, 0, 0x1f))
                return fail("unescaped " + esc(ch) + " in string", "");

            // The usual case: non-escaped characters
            if (ch != '\\') {
                encode_utf8(last_escaped_codepoint, out);
                last_escaped_codepoint = -1;
                out += ch;
                continue;
            }

            // Handle escapes
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            ch = str[i++];

            if (ch == 'u') {
                // Extract 4-byte escape sequence
                string esc = str.substr(i, 4);
                // Explicitly check length of the substring. The following loop
                // relies on std::string returning the terminating NUL when
                // accessing str[length]. Checking here reduces brittleness.
                if (esc.length() < 4) {
                    return fail("bad \\u escape: " + esc, "");
                }
                for (size_t j = 0; j < 4; j++) {
                    if (!in_range(esc[j], 'a', 'f') && !in_range(esc[j], 'A', 'F')
                            && !in_range(esc[j], '0', '9'))
                        return fail("bad \\u escape: " + esc, "");
                }

                long codepoint = strtol(esc.data(), nullptr, 16);

                // JSON specifies that characters outside the BMP shall be encoded as a pair
                // of 4-hex-digit \u escapes encoding their surrogate pair components. Check
                // whether we're in the middle of such a beast: the previous codepoint was an
                // escaped lead (high) surrogate, and this is a trail (low) surrogate.
                if (in_range(last_escaped_codepoint, 0xD800, 0xDBFF)
                        && in_range(codepoint, 0xDC00, 0xDFFF)) {
                    // Reassemble the two surrogate pairs into one astral-plane character, per
                    // the UTF-16 algorithm.
                    encode_utf8((((last_escaped_codepoint - 0xD800) << 10)
                                 | (codepoint - 0xDC00)) + 0x10000, out);
                    last_escaped_codepoint = -1;
                } else {
                    encode_utf8(last_escaped_codepoint, out);
                    last_escaped_codepoint = codepoint;
                }

                i += 4;
                continue;
            }

            encode_utf8(last_escaped_codepoint, out);
            last_escaped_codepoint = -1;

            if (ch == 'b') {
                out += '\b';
            } else if (ch == 'f') {
                out += '\f';
            } else if (ch == 'n') {
                out += '\n';
            } else if (ch == 'r') {
                out += '\r';
            } else if (ch == 't') {
                out += '\t';
            } else if (ch == '"' || ch == '\\' || ch == '/') {
                out += ch;
            } else {
                return fail("invalid escape character " + esc(ch), "");
            }
        }
    }